

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkShapes.cpp
# Opt level: O1

void __thiscall
CoreML::NeuralNetworkShaper::shapePaddingLayer
          (NeuralNetworkShaper *this,NeuralNetworkLayer *specLayer)

{
  LogMessage *pLVar1;
  mapped_type *this_00;
  mapped_type *this_01;
  ShapeRange *pSVar2;
  ShapeRange *pSVar3;
  LayerUnion from;
  size_t val;
  size_t val_00;
  size_t val_01;
  BorderAmounts *pBVar4;
  BorderAmounts *pBVar5;
  PaddingLayerParams padding;
  size_t local_228;
  ShapeRange local_220;
  ShapeRange local_200;
  LogMessage local_1e0;
  PaddingLayerParams local_1a8;
  LogMessage local_180;
  LogMessage local_148;
  LogMessage local_110;
  LogMessage local_d8;
  LogMessage local_a0;
  LogMessage local_68;
  
  if ((specLayer->input_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_d8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar1 = google::protobuf::internal::LogMessage::operator<<
                       (&local_d8,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_1e0,pLVar1);
    google::protobuf::internal::LogMessage::~LogMessage(&local_d8);
  }
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
            ::operator[](&this->blobShapes,
                         (key_type *)
                         ((specLayer->input_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
  if ((specLayer->output_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_a0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar1 = google::protobuf::internal::LogMessage::operator<<
                       (&local_a0,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_1e0,pLVar1);
    google::protobuf::internal::LogMessage::~LogMessage(&local_a0);
  }
  this_01 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
            ::operator[](&this->blobShapes,
                         (key_type *)
                         ((specLayer->output_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
  if ((specLayer->output_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar1 = google::protobuf::internal::LogMessage::operator<<
                       (&local_68,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_1e0,pLVar1);
    google::protobuf::internal::LogMessage::~LogMessage(&local_68);
  }
  ShapeConstraint::setName
            (this_01,(string *)((specLayer->output_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
  pSVar2 = ShapeConstraint::sequenceRange(this_01);
  pSVar3 = ShapeConstraint::sequenceRange(this_00);
  ShapeRange::intersect((ShapeRange *)&local_1e0,pSVar2,pSVar3);
  ShapeConstraint::updateSequenceRange(this_01,(ShapeRange *)&local_1e0);
  pSVar2 = ShapeConstraint::batchRange(this_01);
  pSVar3 = ShapeConstraint::batchRange(this_00);
  ShapeRange::intersect((ShapeRange *)&local_1e0,pSVar2,pSVar3);
  ShapeConstraint::updateBatchRange(this_01,(ShapeRange *)&local_1e0);
  pSVar2 = ShapeConstraint::sequenceRange(this_01);
  ShapeConstraint::updateSequenceRange(this_00,pSVar2);
  pSVar2 = ShapeConstraint::batchRange(this_01);
  ShapeConstraint::updateBatchRange(this_00,pSVar2);
  pSVar2 = ShapeConstraint::channelRange(this_01);
  ShapeConstraint::updateChannelRange(this_00,pSVar2);
  if (specLayer->_oneof_case_[0] == 200) {
    from = specLayer->layer_;
  }
  else {
    from.padding_ = Specification::PaddingLayerParams::default_instance();
  }
  Specification::PaddingLayerParams::PaddingLayerParams(&local_1a8,from.padding_);
  pBVar4 = local_1a8.paddingamounts_;
  if (local_1a8.paddingamounts_ == (BorderAmounts *)0x0) {
    pBVar4 = (BorderAmounts *)&Specification::_BorderAmounts_default_instance_;
  }
  if ((pBVar4->borderamounts_).super_RepeatedPtrFieldBase.current_size_ == 0) {
    val_01 = 0;
    val = 0;
    local_228 = 0;
    val_00 = 0;
  }
  else {
    if ((pBVar4->borderamounts_).super_RepeatedPtrFieldBase.current_size_ < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_180,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5ca);
      pLVar1 = google::protobuf::internal::LogMessage::operator<<
                         (&local_180,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_1e0,pLVar1);
      google::protobuf::internal::LogMessage::~LogMessage(&local_180);
    }
    pBVar5 = local_1a8.paddingamounts_;
    if (local_1a8.paddingamounts_ == (BorderAmounts *)0x0) {
      pBVar5 = (BorderAmounts *)&Specification::_BorderAmounts_default_instance_;
    }
    local_228 = *(size_t *)
                 ((long)((pBVar4->borderamounts_).super_RepeatedPtrFieldBase.rep_)->elements[0] +
                 0x10);
    if ((pBVar5->borderamounts_).super_RepeatedPtrFieldBase.current_size_ < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_148,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5ca);
      pLVar1 = google::protobuf::internal::LogMessage::operator<<
                         (&local_148,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_1e0,pLVar1);
      google::protobuf::internal::LogMessage::~LogMessage(&local_148);
    }
    pBVar4 = local_1a8.paddingamounts_;
    if (local_1a8.paddingamounts_ == (BorderAmounts *)0x0) {
      pBVar4 = (BorderAmounts *)&Specification::_BorderAmounts_default_instance_;
    }
    val_00 = *(size_t *)
              ((long)((pBVar5->borderamounts_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x18)
    ;
    if ((pBVar4->borderamounts_).super_RepeatedPtrFieldBase.current_size_ < 2) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_110,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5ca);
      pLVar1 = google::protobuf::internal::LogMessage::operator<<
                         (&local_110,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_1e0,pLVar1);
      google::protobuf::internal::LogMessage::~LogMessage(&local_110);
    }
    pBVar5 = local_1a8.paddingamounts_;
    if (local_1a8.paddingamounts_ == (BorderAmounts *)0x0) {
      pBVar5 = (BorderAmounts *)&Specification::_BorderAmounts_default_instance_;
    }
    val_01 = *(size_t *)
              (*(long *)((pBVar4->borderamounts_).super_RepeatedPtrFieldBase.rep_ + 1) + 0x10);
    if ((pBVar5->borderamounts_).super_RepeatedPtrFieldBase.current_size_ < 2) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_1e0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5ca);
      pLVar1 = google::protobuf::internal::LogMessage::operator<<
                         (&local_1e0,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_220,pLVar1);
      google::protobuf::internal::LogMessage::~LogMessage(&local_1e0);
    }
    val = *(size_t *)
           (*(long *)((pBVar5->borderamounts_).super_RepeatedPtrFieldBase.rep_ + 1) + 0x18);
  }
  pSVar2 = ShapeConstraint::channelRange(this_01);
  pSVar3 = ShapeConstraint::channelRange(this_00);
  ShapeRange::intersect(&local_220,pSVar2,pSVar3);
  ShapeConstraint::updateChannelRange(this_01,&local_220);
  pSVar2 = ShapeConstraint::heightRange(this_00);
  ShapeRange::operator+(&local_200,pSVar2,local_228);
  ShapeRange::operator+(&local_220,&local_200,val_00);
  ShapeConstraint::updateHeightRange(this_01,&local_220);
  pSVar2 = ShapeConstraint::widthRange(this_00);
  ShapeRange::operator+(&local_200,pSVar2,val);
  ShapeRange::operator+(&local_220,&local_200,val_01);
  ShapeConstraint::updateWidthRange(this_01,&local_220);
  pSVar2 = ShapeConstraint::heightRange(this_01);
  ShapeRange::operator-(&local_200,pSVar2,local_228);
  ShapeRange::operator-(&local_220,&local_200,val_00);
  ShapeConstraint::updateHeightRange(this_00,&local_220);
  pSVar2 = ShapeConstraint::widthRange(this_01);
  ShapeRange::operator-(&local_200,pSVar2,val_01);
  ShapeRange::operator-(&local_220,&local_200,val);
  ShapeConstraint::updateWidthRange(this_00,&local_220);
  Specification::PaddingLayerParams::~PaddingLayerParams(&local_1a8);
  return;
}

Assistant:

void NeuralNetworkShaper::shapePaddingLayer(const Specification::NeuralNetworkLayer& specLayer) {

    ShapeConstraint& inputShape = blobShapes[specLayer.input(0)];
    ShapeConstraint& outputShape = blobShapes[specLayer.output(0)];
    outputShape.setName(specLayer.output(0));

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Padding layer " << specLayer.name() << " input shapes (before): " << std::endl;
    std::cout << inputShape;
    std::cout << "Padding layer " << specLayer.name() << " output shapes (before): " << std::endl;
    std::cout << outputShape;
#endif

    outputShape.updateSequenceRange(outputShape.sequenceRange().intersect(inputShape.sequenceRange()));
    outputShape.updateBatchRange(outputShape.batchRange().intersect(inputShape.batchRange()));

    inputShape.updateSequenceRange(outputShape.sequenceRange());
    inputShape.updateBatchRange(outputShape.batchRange());
    inputShape.updateChannelRange(outputShape.channelRange());

    Specification::PaddingLayerParams padding = specLayer.padding();

    size_t l, r, t, b;
    l = r = t = b = 0;
    if (padding.paddingamounts().borderamounts_size() != 0){
        t = (size_t)padding.paddingamounts().borderamounts(0).startedgesize();
        b = (size_t)padding.paddingamounts().borderamounts(0).endedgesize();
        l = (size_t)padding.paddingamounts().borderamounts(1).startedgesize();
        r = (size_t)padding.paddingamounts().borderamounts(1).endedgesize();
    }
    outputShape.updateChannelRange(outputShape.channelRange().intersect(inputShape.channelRange()));
    outputShape.updateHeightRange(inputShape.heightRange() + t + b);
    outputShape.updateWidthRange(inputShape.widthRange() + r + l);
    
    // If a fixed constraint for the output shape emerges later in the network, then we can infer a lower bound for the input shape
    inputShape.updateHeightRange(outputShape.heightRange() - t - b);
    inputShape.updateWidthRange(outputShape.widthRange() - l - r);

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Padding layer " << specLayer.name() << " input shapes (after): " << std::endl;
    std::cout << inputShape;
    std::cout << "Padding layer " << specLayer.name() << " output shapes (after): " << std::endl;
    std::cout << outputShape;
#endif

}